

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

void secp256k1_fe_inv_var(secp256k1_fe *r,secp256k1_fe *x)

{
  int64_t iVar1;
  secp256k1_fe *r_00;
  int64_t iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  secp256k1_modinv64_modinfo *psVar8;
  ulong uVar9;
  undefined8 uVar10;
  long lVar11;
  char *pcVar12;
  secp256k1_modinv64_modinfo *extraout_RDX;
  secp256k1_modinv64_modinfo *extraout_RDX_00;
  secp256k1_modinv64_modinfo *extraout_RDX_01;
  secp256k1_modinv64_modinfo *extraout_RDX_02;
  int iVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  char *pcVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  int local_1ac;
  long local_1a8;
  long local_1a0;
  ulong local_188 [2];
  secp256k1_modinv64_signed62 f;
  secp256k1_fe *local_148 [2];
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_trans2x2 local_108;
  secp256k1_modinv64_signed62 d;
  secp256k1_modinv64_signed62 local_b8;
  secp256k1_modinv64_signed62 local_90;
  secp256k1_fe tmp;
  
  local_148[1] = r;
  iVar3 = secp256k1_fe_normalizes_to_zero(x);
  secp256k1_fe_verify(x);
  tmp.n[0] = x->n[0];
  tmp.n[1] = x->n[1];
  tmp.n[2] = x->n[2];
  tmp.n[3] = x->n[3];
  tmp.n[4] = x->n[4];
  tmp.magnitude = x->magnitude;
  tmp.normalized = x->normalized;
  local_148[0] = x;
  secp256k1_fe_normalize_var(&tmp);
  secp256k1_fe_to_signed62(&local_b8,&tmp);
  d.v[2] = 0;
  d.v[3] = 0;
  d.v[0] = 0;
  d.v[1] = 0;
  d.v[4] = 0;
  local_90.v[3] = 0;
  local_90.v[4] = 0;
  local_90.v[1] = 0;
  local_90.v[2] = 0;
  local_90.v[0] = 1;
  f.v[2] = 0;
  f.v[3] = 0;
  f.v[0] = -0x1000003d1;
  f.v[1] = 0;
  f.v[4] = 0x100;
  g.v[4] = local_b8.v[4];
  g.v[2] = local_b8.v[2];
  g.v[3] = local_b8.v[3];
  g.v[0] = local_b8.v[0];
  g.v[1] = local_b8.v[1];
  iVar13 = 0;
  local_1ac = 5;
  local_1a8 = -1;
  do {
    iVar2 = g.v[0];
    iVar1 = f.v[0];
    lVar20 = 1;
    local_188[1] = 0;
    iVar21 = 0x3e;
    uVar17 = g.v[0];
    lVar19 = 0;
    local_1a0 = lVar20;
    local_188[0] = f.v[0];
    while( true ) {
      lVar22 = lVar19;
      uVar4 = secp256k1_ctz64_var(-1L << ((byte)iVar21 & 0x3f) | uVar17);
      psVar8 = (secp256k1_modinv64_modinfo *)(ulong)uVar4;
      local_1a8 = local_1a8 - (ulong)uVar4;
      bVar6 = (byte)uVar4;
      uVar16 = uVar17 >> (bVar6 & 0x3f);
      local_1a0 = local_1a0 << (bVar6 & 0x3f);
      lVar19 = local_188[1] << (bVar6 & 0x3f);
      iVar21 = iVar21 - uVar4;
      if (iVar21 == 0) break;
      if ((local_188[0] & 1) == 0) {
        pcVar12 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modinv64_impl.h"
        ;
        pcVar18 = "test condition failed: (f & 1) == 1";
        uVar10 = 0x103;
        goto LAB_001126f7;
      }
      if ((uVar16 & 1) == 0) {
        pcVar12 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modinv64_impl.h"
        ;
        pcVar18 = "test condition failed: (g & 1) == 1";
        uVar10 = 0x104;
        goto LAB_001126f7;
      }
      bVar6 = 0x3e - (char)iVar21;
      if (lVar19 * iVar2 + local_1a0 * iVar1 != local_188[0] << (bVar6 & 0x3f)) {
        pcVar12 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modinv64_impl.h"
        ;
        pcVar18 = "test condition failed: (u * f0 + v * g0) == f << (62 - i)";
        uVar10 = 0x105;
        goto LAB_001126f7;
      }
      if (lVar20 * iVar2 + lVar22 * iVar1 != uVar16 << (bVar6 & 0x3f)) {
        pcVar12 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modinv64_impl.h"
        ;
        pcVar18 = "test condition failed: (q * f0 + r * g0) == g << (62 - i)";
        uVar10 = 0x106;
        goto LAB_001126f7;
      }
      if (local_1a8 - 0x2eaU < 0xfffffffffffffa2d) {
        pcVar12 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modinv64_impl.h"
        ;
        pcVar18 = "test condition failed: eta >= -745 && eta <= 745";
        uVar10 = 0x108;
        goto LAB_001126f7;
      }
      iVar15 = (int)uVar16;
      if (local_1a8 < 0) {
        local_1a8 = -local_1a8;
        iVar7 = (int)local_1a8 + 1;
        if (iVar21 <= iVar7) {
          iVar7 = iVar21;
        }
        if (iVar7 - 0x3fU < 0xffffffc2) {
          pcVar12 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modinv64_impl.h"
          ;
          pcVar18 = "test condition failed: limit > 0 && limit <= 62";
          uVar10 = 0x114;
          goto LAB_001126f7;
        }
        lVar11 = -lVar19;
        lVar14 = -local_1a0;
        uVar17 = -local_188[0];
        uVar5 = (ulong)(0x3fL << (-(char)iVar7 & 0x3fU)) >> (-(char)iVar7 & 0x3fU);
        uVar4 = (iVar15 * iVar15 + 0x3e) * iVar15 * (int)uVar17 & (uint)uVar5;
        local_188[1] = lVar20;
      }
      else {
        iVar7 = (int)local_1a8 + 1;
        if (iVar21 <= iVar7) {
          iVar7 = iVar21;
        }
        if (iVar7 - 0x3fU < 0xffffffc2) {
          pcVar12 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modinv64_impl.h"
          ;
          pcVar18 = "test condition failed: limit > 0 && limit <= 62";
          uVar10 = 0x11e;
          goto LAB_001126f7;
        }
        uVar5 = (ulong)(0xfL << (-(char)iVar7 & 0x3fU)) >> (-(char)iVar7 & 0x3fU);
        uVar4 = -(iVar15 * (((int)local_188[0] * 2 + 2U & 8) + (int)local_188[0])) & (uint)uVar5;
        uVar17 = uVar16;
        lVar14 = lVar22;
        lVar11 = lVar20;
        lVar22 = local_1a0;
        uVar16 = local_188[0];
        local_188[1] = lVar19;
      }
      uVar9 = (ulong)uVar4;
      uVar17 = uVar17 + uVar9 * uVar16;
      lVar20 = lVar11 + uVar9 * local_188[1];
      lVar19 = lVar22 * uVar9 + lVar14;
      local_1a0 = lVar22;
      local_188[0] = uVar16;
      if ((uVar17 & uVar5) != 0) {
        pcVar12 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modinv64_impl.h"
        ;
        pcVar18 = "test condition failed: (g & m) == 0";
        uVar10 = 0x129;
        goto LAB_001126f7;
      }
    }
    local_108.u = local_1a0;
    local_108.v = lVar19;
    local_108.q = lVar22;
    local_108.r = lVar20;
    iVar21 = secp256k1_modinv64_det_check_pow2(&local_108,0x3e,0);
    if (iVar21 == 0) {
      pcVar12 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modinv64_impl.h"
      ;
      pcVar18 = "test condition failed: secp256k1_modinv64_det_check_pow2(t, 62, 0)";
      uVar10 = 0x135;
      goto LAB_001126f7;
    }
    secp256k1_modinv64_update_de_62(&d,&local_90,&local_108,psVar8);
    iVar21 = secp256k1_modinv64_mul_cmp_62(&f,local_1ac,&secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar21 < 1) {
      pcVar12 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modinv64_impl.h"
      ;
      pcVar18 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) > 0";
      uVar10 = 0x29b;
      goto LAB_001126f7;
    }
    lVar19 = 1;
    iVar21 = secp256k1_modinv64_mul_cmp_62(&f,local_1ac,&secp256k1_const_modinfo_fe.modulus,1);
    if (0 < iVar21) {
      pcVar12 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modinv64_impl.h"
      ;
      pcVar18 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0";
      uVar10 = 0x29c;
      goto LAB_001126f7;
    }
    iVar21 = secp256k1_modinv64_mul_cmp_62(&g,local_1ac,&secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar21 < 1) {
      pcVar12 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modinv64_impl.h"
      ;
      pcVar18 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, -1) > 0";
      uVar10 = 0x29d;
      goto LAB_001126f7;
    }
    iVar21 = secp256k1_modinv64_mul_cmp_62(&g,local_1ac,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar21) {
      pcVar12 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modinv64_impl.h"
      ;
      pcVar18 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0";
      uVar10 = 0x29e;
      goto LAB_001126f7;
    }
    secp256k1_modinv64_update_fg_62_var(local_1ac,&f,&g,&local_108);
    lVar20 = (long)local_1ac;
    if (g.v[0] == 0) {
      uVar17 = 0;
      for (; lVar19 < lVar20; lVar19 = lVar19 + 1) {
        uVar17 = uVar17 | g.v[lVar19];
      }
      if (uVar17 == 0) {
        iVar13 = secp256k1_modinv64_mul_cmp_62(&g,local_1ac,&SECP256K1_SIGNED62_ONE,0);
        if (iVar13 != 0) {
          pcVar12 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modinv64_impl.h"
          ;
          pcVar18 = 
          "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, len, &SECP256K1_SIGNED62_ONE, 0) == 0"
          ;
          uVar10 = 0x2c5;
          goto LAB_001126f7;
        }
        iVar13 = secp256k1_modinv64_mul_cmp_62(&f,local_1ac,&SECP256K1_SIGNED62_ONE,-1);
        psVar8 = extraout_RDX;
        if (iVar13 != 0) {
          iVar13 = secp256k1_modinv64_mul_cmp_62(&f,local_1ac,&SECP256K1_SIGNED62_ONE,1);
          psVar8 = extraout_RDX_00;
          if (iVar13 != 0) {
            iVar13 = secp256k1_modinv64_mul_cmp_62(&local_b8,5,&SECP256K1_SIGNED62_ONE,0);
            if (iVar13 == 0) {
              iVar13 = secp256k1_modinv64_mul_cmp_62(&d,5,&SECP256K1_SIGNED62_ONE,0);
              if (iVar13 == 0) {
                iVar13 = secp256k1_modinv64_mul_cmp_62
                                   (&f,local_1ac,&secp256k1_const_modinfo_fe.modulus,1);
                psVar8 = extraout_RDX_01;
                if (iVar13 != 0) {
                  iVar13 = secp256k1_modinv64_mul_cmp_62
                                     (&f,local_1ac,&secp256k1_const_modinfo_fe.modulus,-1);
                  psVar8 = extraout_RDX_02;
                  if (iVar13 != 0) goto LAB_001128e6;
                }
                goto LAB_0011262a;
              }
            }
LAB_001128e6:
            pcVar12 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modinv64_impl.h"
            ;
            pcVar18 = 
            "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, len, &SECP256K1_SIGNED62_ONE, -1) == 0 || secp256k1_modinv64_mul_cmp_62(&f, len, &SECP256K1_SIGNED62_ONE, 1) == 0 || (secp256k1_modinv64_mul_cmp_62(x, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 && secp256k1_modinv64_mul_cmp_62(&d, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 && (secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) == 0 || secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) == 0))"
            ;
            uVar10 = 0x2cc;
            goto LAB_001126f7;
          }
        }
LAB_0011262a:
        secp256k1_modinv64_normalize_62(&d,f.v[lVar20 + -1],psVar8);
        r_00 = local_148[1];
        local_b8.v[4] = d.v[4];
        local_b8.v[2] = d.v[2];
        local_b8.v[3] = d.v[3];
        local_b8.v[0] = d.v[0];
        local_b8.v[1] = d.v[1];
        secp256k1_fe_from_signed62(local_148[1],&local_b8);
        r_00->magnitude = (uint)(0 < local_148[0]->magnitude);
        r_00->normalized = 1;
        iVar13 = secp256k1_fe_normalizes_to_zero(r_00);
        if (iVar13 == iVar3) {
          secp256k1_fe_verify(r_00);
          return;
        }
        pcVar12 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/field_impl.h"
        ;
        pcVar18 = "test condition failed: secp256k1_fe_normalizes_to_zero(r) == input_is_zero";
        uVar10 = 0x189;
        goto LAB_001126f7;
      }
    }
    lVar19 = f.v[lVar20 + -1];
    lVar22 = g.v[lVar20 + -1];
    if (lVar22 >> 0x3f == lVar22 && (lVar19 >> 0x3f == lVar19 && -1 < lVar20 + -2)) {
      local_1ac = local_1ac + -1;
      local_188[lVar20] = local_188[lVar20] | lVar19 << 0x3e;
      local_148[lVar20] = (secp256k1_fe *)((ulong)local_148[lVar20] | lVar22 << 0x3e);
    }
    if (iVar13 == 0xb) {
      pcVar12 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modinv64_impl.h"
      ;
      pcVar18 = "test condition failed: ++i < 12";
      uVar10 = 0x2b9;
      goto LAB_001126f7;
    }
    iVar21 = secp256k1_modinv64_mul_cmp_62(&f,local_1ac,&secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar21 < 1) {
      pcVar12 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modinv64_impl.h"
      ;
      pcVar18 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) > 0";
      uVar10 = 0x2ba;
      goto LAB_001126f7;
    }
    iVar21 = secp256k1_modinv64_mul_cmp_62(&f,local_1ac,&secp256k1_const_modinfo_fe.modulus,1);
    if (0 < iVar21) {
      pcVar12 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modinv64_impl.h"
      ;
      pcVar18 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0";
      uVar10 = 699;
      goto LAB_001126f7;
    }
    iVar21 = secp256k1_modinv64_mul_cmp_62(&g,local_1ac,&secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar21 < 1) {
      pcVar12 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modinv64_impl.h"
      ;
      pcVar18 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, -1) > 0";
      uVar10 = 700;
      goto LAB_001126f7;
    }
    iVar21 = secp256k1_modinv64_mul_cmp_62(&g,local_1ac,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar21) {
      pcVar12 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modinv64_impl.h"
      ;
      pcVar18 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0";
      uVar10 = 0x2bd;
LAB_001126f7:
      fprintf(_stderr,"%s:%d: %s\n",pcVar12,uVar10,pcVar18);
      abort();
    }
    iVar13 = iVar13 + 1;
  } while( true );
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_inv_var(secp256k1_fe *r, const secp256k1_fe *x) {
    int input_is_zero = secp256k1_fe_normalizes_to_zero(x);
    secp256k1_fe_verify(x);
    secp256k1_fe_impl_inv_var(r, x);
    r->magnitude = x->magnitude > 0;
    r->normalized = 1;
    VERIFY_CHECK(secp256k1_fe_normalizes_to_zero(r) == input_is_zero);
    secp256k1_fe_verify(r);
}